

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setup_common.cpp
# Opt level: O2

void __thiscall
ChainTestingSetup::ChainTestingSetup(ChainTestingSetup *this,ChainType chainType,TestOpts opts)

{
  unique_ptr<CScheduler,_std::default_delete<CScheduler>_> *this_00;
  unique_ptr<node::Warnings,_std::default_delete<node::Warnings>_> *this_01;
  long lVar1;
  SignalInterrupt *__args_1;
  KernelNotifications *pKVar2;
  TestOpts opts_00;
  CChainParams *pCVar3;
  SignalInterrupt **ppSVar4;
  _Tuple_impl<0UL,_CScheduler_*,_std::default_delete<CScheduler>_> *p_Var5;
  TestOpts *in_RDX;
  long in_FS_OFFSET;
  undefined8 in_stack_fffffffffffffec8;
  undefined8 in_stack_fffffffffffffed0;
  undefined8 uVar6;
  seconds in_stack_fffffffffffffed8;
  CFeeRate in_stack_fffffffffffffee0;
  _Any_data __tmp;
  undefined1 local_100 [16];
  TestOpts local_f0 [2];
  TestOpts local_98;
  bilingual_str error;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  TestOpts::TestOpts(&local_98,in_RDX);
  opts_00.extra_args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffed0;
  opts_00.extra_args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffec8;
  opts_00.extra_args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffed8.__r;
  opts_00.coins_db_in_memory = (bool)(char)in_stack_fffffffffffffee0.nSatoshisPerK;
  opts_00.block_tree_db_in_memory =
       (bool)(char)((ulong)in_stack_fffffffffffffee0.nSatoshisPerK >> 8);
  opts_00.setup_net = (bool)(char)((ulong)in_stack_fffffffffffffee0.nSatoshisPerK >> 0x10);
  opts_00.setup_validation_interface =
       (bool)(char)((ulong)in_stack_fffffffffffffee0.nSatoshisPerK >> 0x18);
  opts_00.min_validation_cache =
       (bool)(char)((ulong)in_stack_fffffffffffffee0.nSatoshisPerK >> 0x20);
  opts_00._29_3_ = (int3)((ulong)in_stack_fffffffffffffee0.nSatoshisPerK >> 0x28);
  BasicTestingSetup::BasicTestingSetup(&this->super_BasicTestingSetup,chainType,opts_00);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            ((_Vector_base<const_char_*,_std::allocator<const_char_*>_> *)&local_98);
  (this->m_cache_sizes).coins = 0;
  (this->m_cache_sizes).tx_index = 0;
  (this->m_cache_sizes).block_tree_db = 0;
  (this->m_cache_sizes).coins_db = 0;
  (this->m_cache_sizes).filter_index = 0;
  this->m_coins_db_in_memory = true;
  this->m_block_tree_db_in_memory = true;
  *(undefined8 *)&(this->m_make_chainman).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->m_make_chainman).super__Function_base._M_functor + 8) = 0;
  (this->m_make_chainman).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->m_make_chainman)._M_invoker = (_Invoker_type)0x0;
  pCVar3 = Params();
  if (in_RDX->setup_validation_interface == true) {
    std::make_unique<CScheduler>();
    uVar6 = local_100._0_8_;
    this_00 = &(this->super_BasicTestingSetup).m_node.scheduler;
    local_100._0_8_ = (__uniq_ptr_impl<CScheduler,_std::default_delete<CScheduler>_>)0x0;
    std::__uniq_ptr_impl<CScheduler,_std::default_delete<CScheduler>_>::reset
              ((__uniq_ptr_impl<CScheduler,_std::default_delete<CScheduler>_> *)this_00,
               (pointer)uVar6);
    std::unique_ptr<CScheduler,_std::default_delete<CScheduler>_>::~unique_ptr
              ((unique_ptr<CScheduler,_std::default_delete<CScheduler>_> *)local_100);
    error.original._M_dataplus._M_p = (pointer)0x0;
    local_100._0_8_ = operator_new(0x20);
    (((__uniq_ptr_impl<ValidationSignalsImpl,_std::default_delete<ValidationSignalsImpl>_> *)
     &(((CScheduler *)local_100._0_8_)->m_service_thread)._M_id._M_thread)->_M_t).
    super__Tuple_impl<0UL,_ValidationSignalsImpl_*,_std::default_delete<ValidationSignalsImpl>_>.
    super__Head_base<0UL,_ValidationSignalsImpl_*,_false>._M_head_impl =
         (ValidationSignalsImpl *)&PTR___State_01141650;
    (((CScheduler *)local_100._0_8_)->newTaskMutex).super_mutex.super___mutex_base._M_mutex.__align
         = (long)this;
    *(char **)((long)&(((CScheduler *)local_100._0_8_)->newTaskMutex).super_mutex.super___mutex_base
                      ._M_mutex + 8) = "scheduler";
    *(code **)((long)&(((CScheduler *)local_100._0_8_)->newTaskMutex).super_mutex.super___mutex_base
                      ._M_mutex + 0x10) = util::TraceThread;
    std::thread::_M_start_thread(&error,local_100,0);
    if ((CScheduler *)local_100._0_8_ != (CScheduler *)0x0) {
      (**(code **)((long)&(((((__uniq_ptr_impl<ValidationSignalsImpl,_std::default_delete<ValidationSignalsImpl>_>
                               *)&(((thread *)local_100._0_8_)->_M_id)._M_thread)->_M_t).
                            super__Tuple_impl<0UL,_ValidationSignalsImpl_*,_std::default_delete<ValidationSignalsImpl>_>
                            .super__Head_base<0UL,_ValidationSignalsImpl_*,_false>._M_head_impl)->
                          m_mutex).super_mutex.super___mutex_base._M_mutex.__data + 8))();
    }
    std::thread::operator=
              (&((this_00->_M_t).super___uniq_ptr_impl<CScheduler,_std::default_delete<CScheduler>_>
                 ._M_t.super__Tuple_impl<0UL,_CScheduler_*,_std::default_delete<CScheduler>_>.
                 super__Head_base<0UL,_CScheduler_*,_false>._M_head_impl)->m_service_thread,
               (thread *)&error);
    std::thread::~thread((thread *)&error);
    std::make_unique<SerialTaskRunner,CScheduler&>((CScheduler *)&error);
    std::
    make_unique<ValidationSignals,std::unique_ptr<SerialTaskRunner,std::default_delete<SerialTaskRunner>>>
              ((unique_ptr<SerialTaskRunner,_std::default_delete<SerialTaskRunner>_> *)local_100);
    uVar6 = local_100._0_8_;
    local_100._0_8_ = (__uniq_ptr_impl<CScheduler,_std::default_delete<CScheduler>_>)0x0;
    std::__uniq_ptr_impl<ValidationSignals,_std::default_delete<ValidationSignals>_>::reset
              ((__uniq_ptr_impl<ValidationSignals,_std::default_delete<ValidationSignals>_> *)
               &(this->super_BasicTestingSetup).m_node.validation_signals,(pointer)uVar6);
    std::unique_ptr<ValidationSignals,_std::default_delete<ValidationSignals>_>::~unique_ptr
              ((unique_ptr<ValidationSignals,_std::default_delete<ValidationSignals>_> *)local_100);
    if (error.original._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)error.original._M_dataplus._M_p + 8))();
    }
  }
  error.original._M_dataplus._M_p = (pointer)&error.original.field_2;
  error.original._M_string_length = 0;
  error.original.field_2._M_local_buf[0] = '\0';
  error.translated._M_dataplus._M_p = (pointer)&error.translated.field_2;
  error.translated._M_string_length = 0;
  error.translated.field_2._M_local_buf[0] = '\0';
  MemPoolOptionsForTest((Options *)local_100,&(this->super_BasicTestingSetup).m_node);
  std::make_unique<CTxMemPool,kernel::MemPoolOptions,bilingual_str&>
            ((MemPoolOptions *)&stack0xfffffffffffffec8,(bilingual_str *)local_100);
  std::__uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>::reset
            ((__uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_> *)
             &(this->super_BasicTestingSetup).m_node.mempool,(pointer)in_stack_fffffffffffffec8);
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::~unique_ptr
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)&stack0xfffffffffffffec8);
  local_100[0] = error.original._M_string_length == 0;
  inline_assertion_check<true,bool>
            ((bool *)local_100,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/setup_common.cpp"
             ,0xde,"ChainTestingSetup","error.empty()");
  std::make_unique<node::Warnings>();
  uVar6 = local_100._0_8_;
  this_01 = &(this->super_BasicTestingSetup).m_node.warnings;
  local_100._0_8_ = (__uniq_ptr_impl<CScheduler,_std::default_delete<CScheduler>_>)0x0;
  std::__uniq_ptr_impl<node::Warnings,_std::default_delete<node::Warnings>_>::reset
            ((__uniq_ptr_impl<node::Warnings,_std::default_delete<node::Warnings>_> *)this_01,
             (pointer)uVar6);
  std::unique_ptr<node::Warnings,_std::default_delete<node::Warnings>_>::~unique_ptr
            ((unique_ptr<node::Warnings,_std::default_delete<node::Warnings>_> *)local_100);
  ::node::CalculateCacheSizes((CacheSizes *)local_100,&(this->super_BasicTestingSetup).m_args,0);
  (this->m_cache_sizes).filter_index =
       (int64_t)local_f0[0].extra_args.
                super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
  (this->m_cache_sizes).coins =
       (int64_t)local_f0[0].extra_args.
                super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_start;
  (this->m_cache_sizes).tx_index =
       (int64_t)local_f0[0].extra_args.
                super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
  (this->m_cache_sizes).block_tree_db = local_100._0_8_;
  (this->m_cache_sizes).coins_db = local_100._8_8_;
  ppSVar4 = inline_assertion_check<true,util::SignalInterrupt*&>
                      (&(this->super_BasicTestingSetup).m_node.shutdown,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/setup_common.cpp"
                       ,0xe3,"ChainTestingSetup","m_node.shutdown");
  __args_1 = *ppSVar4;
  inline_assertion_check<true,std::unique_ptr<node::Warnings,std::default_delete<node::Warnings>>&>
            (this_01,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/setup_common.cpp"
             ,0xe3,"ChainTestingSetup","m_node.warnings");
  std::
  make_unique<node::KernelNotifications,util::SignalInterrupt&,std::atomic<int>&,node::Warnings&>
            ((SignalInterrupt *)local_100,(atomic<int> *)__args_1,
             (Warnings *)&(this->super_BasicTestingSetup).m_node.exit_status);
  uVar6 = local_100._0_8_;
  local_100._0_8_ = (__uniq_ptr_impl<CScheduler,_std::default_delete<CScheduler>_>)0x0;
  pKVar2 = (this->super_BasicTestingSetup).m_node.notifications._M_t.
           super___uniq_ptr_impl<node::KernelNotifications,_std::default_delete<node::KernelNotifications>_>
           ._M_t.
           super__Tuple_impl<0UL,_node::KernelNotifications_*,_std::default_delete<node::KernelNotifications>_>
           .super__Head_base<0UL,_node::KernelNotifications_*,_false>._M_head_impl;
  (this->super_BasicTestingSetup).m_node.notifications._M_t.
  super___uniq_ptr_impl<node::KernelNotifications,_std::default_delete<node::KernelNotifications>_>.
  _M_t.
  super__Tuple_impl<0UL,_node::KernelNotifications_*,_std::default_delete<node::KernelNotifications>_>
  .super__Head_base<0UL,_node::KernelNotifications_*,_false>._M_head_impl =
       (KernelNotifications *)uVar6;
  if (pKVar2 != (KernelNotifications *)0x0) {
    (*(pKVar2->super_Notifications)._vptr_Notifications[1])();
    if ((_Head_base<0UL,_CScheduler_*,_false>)local_100._0_8_ !=
        (_Head_base<0UL,_CScheduler_*,_false>)0x0) {
      (**(code **)((((thread *)local_100._0_8_)->_M_id)._M_thread + 8))();
    }
  }
  local_100._0_8_ = this;
  local_100._8_8_ = pCVar3;
  TestOpts::TestOpts(local_f0,in_RDX);
  uVar6 = 0;
  p_Var5 = (_Tuple_impl<0UL,_CScheduler_*,_std::default_delete<CScheduler>_> *)operator_new(0x30);
  p_Var5->super__Head_base<0UL,_CScheduler_*,_false> =
       (_Head_base<0UL,_CScheduler_*,_false>)local_100._0_8_;
  p_Var5[1].super__Head_base<0UL,_CScheduler_*,_false>._M_head_impl = (CScheduler *)local_100._8_8_;
  p_Var5[2].super__Head_base<0UL,_CScheduler_*,_false>._M_head_impl =
       (CScheduler *)
       local_f0[0].extra_args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  p_Var5[3].super__Head_base<0UL,_CScheduler_*,_false>._M_head_impl =
       (CScheduler *)
       local_f0[0].extra_args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  p_Var5[4].super__Head_base<0UL,_CScheduler_*,_false>._M_head_impl =
       (CScheduler *)
       local_f0[0].extra_args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_f0[0].extra_args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f0[0].extra_args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f0[0].extra_args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(bool *)((long)&p_Var5[5].super__Head_base<0UL,_CScheduler_*,_false>._M_head_impl + 4) =
       local_f0[0].min_validation_cache;
  *(undefined4 *)&p_Var5[5].super__Head_base<0UL,_CScheduler_*,_false> = local_f0[0]._24_4_;
  *(_Tuple_impl<0UL,_CScheduler_*,_std::default_delete<CScheduler>_> **)
   &(this->m_make_chainman).super__Function_base._M_functor = p_Var5;
  *(undefined8 *)((long)&(this->m_make_chainman).super__Function_base._M_functor + 8) = uVar6;
  (this->m_make_chainman).super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/setup_common.cpp:229:23)>
       ::_M_manager;
  (this->m_make_chainman)._M_invoker =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/setup_common.cpp:229:23)>
       ::_M_invoke;
  std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffffec8);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            ((_Vector_base<const_char_*,_std::allocator<const_char_*>_> *)local_f0);
  _GLOBAL__N_1::std::function<void_()>::operator()((function<void_()> *)&this->m_make_chainman);
  bilingual_str::~bilingual_str(&error);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

ChainTestingSetup::ChainTestingSetup(const ChainType chainType, TestOpts opts)
    : BasicTestingSetup(chainType, opts)
{
    const CChainParams& chainparams = Params();

    // We have to run a scheduler thread to prevent ActivateBestChain
    // from blocking due to queue overrun.
    if (opts.setup_validation_interface) {
        m_node.scheduler = std::make_unique<CScheduler>();
        m_node.scheduler->m_service_thread = std::thread(util::TraceThread, "scheduler", [&] { m_node.scheduler->serviceQueue(); });
        m_node.validation_signals = std::make_unique<ValidationSignals>(std::make_unique<SerialTaskRunner>(*m_node.scheduler));
    }

    bilingual_str error{};
    m_node.mempool = std::make_unique<CTxMemPool>(MemPoolOptionsForTest(m_node), error);
    Assert(error.empty());
    m_node.warnings = std::make_unique<node::Warnings>();

    m_cache_sizes = CalculateCacheSizes(m_args);

    m_node.notifications = std::make_unique<KernelNotifications>(*Assert(m_node.shutdown), m_node.exit_status, *Assert(m_node.warnings));

    m_make_chainman = [this, &chainparams, opts] {
        Assert(!m_node.chainman);
        ChainstateManager::Options chainman_opts{
            .chainparams = chainparams,
            .datadir = m_args.GetDataDirNet(),
            .check_block_index = 1,
            .notifications = *m_node.notifications,
            .signals = m_node.validation_signals.get(),
            .worker_threads_num = 2,
        };
        if (opts.min_validation_cache) {
            chainman_opts.script_execution_cache_bytes = 0;
            chainman_opts.signature_cache_bytes = 0;
        }
        const BlockManager::Options blockman_opts{
            .chainparams = chainman_opts.chainparams,
            .blocks_dir = m_args.GetBlocksDirPath(),
            .notifications = chainman_opts.notifications,
        };
        m_node.chainman = std::make_unique<ChainstateManager>(*Assert(m_node.shutdown), chainman_opts, blockman_opts);
        LOCK(m_node.chainman->GetMutex());
        m_node.chainman->m_blockman.m_block_tree_db = std::make_unique<BlockTreeDB>(DBParams{
            .path = m_args.GetDataDirNet() / "blocks" / "index",
            .cache_bytes = static_cast<size_t>(m_cache_sizes.block_tree_db),
            .memory_only = true,
        });
    };
    m_make_chainman();
}